

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pMVar3;
  Colour colourGuard;
  allocator local_79;
  string local_78 [32];
  Colour colourGuard_1;
  string local_50 [32];
  
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar3 = (this->itMessage)._M_current;
  if (pMVar3 != pMVar1) {
    colourGuard.m_moved = false;
    Colour::use(colour);
    poVar2 = std::operator<<(this->stream," with ");
    std::__cxx11::string::string(local_78,"message",&local_79);
    _colourGuard_1 = ((long)pMVar1 - (long)pMVar3) / 0x78;
    std::__cxx11::string::string(local_50,local_78);
    operator<<(poVar2,(pluralise *)&colourGuard_1);
    std::operator<<(poVar2,":");
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_78);
    Colour::~Colour(&colourGuard);
    while (pMVar3 = (this->itMessage)._M_current, pMVar3 != pMVar1) {
      if ((this->printInfoMessages != false) || (pMVar3->type != Info)) {
        poVar2 = std::operator<<(this->stream," \'");
        poVar2 = std::operator<<(poVar2,(string *)&((this->itMessage)._M_current)->message);
        std::operator<<(poVar2,"\'");
        pMVar3 = (this->itMessage)._M_current + 1;
        (this->itMessage)._M_current = pMVar3;
        if (pMVar3 != pMVar1) {
          _colourGuard_1 = _colourGuard_1 & 0xffffffffffffff00;
          Colour::use(FileName);
          std::operator<<(this->stream," and");
          Colour::~Colour(&colourGuard_1);
        }
      }
    }
  }
  return;
}

Assistant:

Equals( std::string const& str, CaseSensitive::Choice caseSensitivity = CaseSensitive::Yes )
            :   m_data( str, caseSensitivity )
            {}